

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O2

int xmlFAParsePiece(xmlRegParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  byte bVar2;
  xmlRegStatePtr from;
  xmlRegStatePtr pxVar3;
  xmlRegStatePtr pxVar4;
  byte *pbVar5;
  xmlChar *pxVar6;
  xmlRegQuantType xVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  xmlRegAtomPtr pxVar11;
  char *extra;
  int local_30 [2];
  
  ctxt->atom = (xmlRegAtomPtr)0x0;
  local_30[1] = 4;
  uVar8 = xmlGetUTF8Char(ctxt->cur,local_30 + 1);
  if ((int)uVar8 < 0) {
    ctxt->error = 0x5aa;
    xmlRegexpErrCompile(ctxt,"Invalid UTF-8");
LAB_00178956:
    pxVar6 = ctxt->cur;
    xVar1 = *pxVar6;
    if (xVar1 != '(') {
      if (xVar1 != '.') {
        if (xVar1 == '[') {
          ctxt->cur = pxVar6 + 1;
          pxVar11 = xmlRegNewAtom(ctxt,XML_REGEXP_RANGES);
          ctxt->atom = pxVar11;
          if (pxVar11 != (xmlRegAtomPtr)0x0) {
            xmlFAParseCharGroup(ctxt);
            if (*ctxt->cur == ']') {
              ctxt->cur = ctxt->cur + 1;
              goto LAB_00178a8b;
            }
            ctxt->error = 0x5aa;
            extra = "xmlFAParseCharClass: \']\' expected";
            goto LAB_00178a43;
          }
          goto LAB_00178a92;
        }
        if (xVar1 != '\\') {
          return 0;
        }
      }
      xmlFAParseCharClassEsc(ctxt);
      goto LAB_00178a8b;
    }
    ctxt->cur = pxVar6 + 1;
    if (0x31 < ctxt->depth) {
      ctxt->error = 0x5aa;
      extra = "xmlFAParseAtom: maximum nesting depth exceeded";
LAB_00178a43:
      xmlRegexpErrCompile(ctxt,extra);
      goto LAB_00178a8b;
    }
    xmlFAGenerateEpsilonTransition(ctxt,ctxt->state,(xmlRegStatePtr)0x0);
    from = ctxt->state;
    xmlFAGenerateEpsilonTransition(ctxt,from,(xmlRegStatePtr)0x0);
    pxVar3 = ctxt->end;
    pxVar4 = ctxt->state;
    ctxt->end = (xmlRegStatePtr)0x0;
    ctxt->atom = (xmlRegAtomPtr)0x0;
    ctxt->depth = ctxt->depth + 1;
    xmlFAParseRegExp(ctxt,0);
    ctxt->depth = ctxt->depth + -1;
    if (*ctxt->cur == ')') {
      ctxt->cur = ctxt->cur + 1;
    }
    else {
      ctxt->error = 0x5aa;
      xmlRegexpErrCompile(ctxt,"xmlFAParseAtom: expecting \')\'");
    }
    pxVar11 = xmlRegNewAtom(ctxt,XML_REGEXP_SUBREG);
    ctxt->atom = pxVar11;
    if (pxVar11 != (xmlRegAtomPtr)0x0) {
      pxVar11->start = pxVar4;
      pxVar11->start0 = from;
      pxVar11->stop = ctxt->state;
      ctxt->end = pxVar3;
      goto LAB_00178a8b;
    }
LAB_00178a92:
    ctxt->error = 0x5aa;
    xmlRegexpErrCompile(ctxt,"internal: no atom generated");
  }
  else {
    if ((((uVar8 & 0x7ffffffc) == 0x28) ||
        ((uVar8 - 0x5b < 0x22 && ((0x200000007U >> ((ulong)(uVar8 - 0x5b) & 0x3f) & 1) != 0)))) ||
       ((uVar8 < 0x40 && ((0x8000400000000001U >> ((ulong)uVar8 & 0x3f) & 1) != 0))))
    goto LAB_00178956;
    pxVar11 = xmlRegNewAtom(ctxt,XML_REGEXP_CHARVAL);
    ctxt->atom = pxVar11;
    if (pxVar11 == (xmlRegAtomPtr)0x0) goto LAB_00178a92;
    local_30[0] = 4;
    iVar9 = xmlGetUTF8Char(ctxt->cur,local_30);
    if (iVar9 < 0) {
      ctxt->error = 0x5aa;
      extra = "Invalid UTF-8";
      goto LAB_00178a43;
    }
    ctxt->atom->codepoint = iVar9;
    ctxt->cur = ctxt->cur + local_30[0];
LAB_00178a8b:
    if (ctxt->atom == (xmlRegAtomPtr)0x0) goto LAB_00178a92;
  }
  pbVar5 = ctxt->cur;
  bVar2 = *pbVar5;
  if (1 < bVar2 - 0x2a) {
    if (bVar2 == 0x7b) {
      ctxt->cur = pbVar5 + 1;
      iVar9 = xmlFAParseQuantExact(ctxt);
      if (iVar9 < 0) {
        ctxt->error = 0x5aa;
        xmlRegexpErrCompile(ctxt,"Improper quantifier");
        iVar9 = 0;
      }
      pxVar6 = ctxt->cur;
      iVar10 = 0;
      if (*pxVar6 == ',') {
        ctxt->cur = pxVar6 + 1;
        iVar10 = 0x7fffffff;
        if ((pxVar6[1] != '}') && (iVar10 = xmlFAParseQuantExact(ctxt), iVar10 < 0)) {
          ctxt->error = 0x5aa;
          xmlRegexpErrCompile(ctxt,"Improper quantifier");
          iVar10 = 0;
        }
      }
      if (*ctxt->cur == '}') {
        ctxt->cur = ctxt->cur + 1;
      }
      else {
        ctxt->error = 0x5aa;
        xmlRegexpErrCompile(ctxt,"Unterminated quantifier");
      }
      pxVar11 = ctxt->atom;
      if (pxVar11 == (xmlRegAtomPtr)0x0) {
        return 1;
      }
      if (iVar10 == 0) {
        iVar10 = iVar9;
      }
      pxVar11->quant = XML_REGEXP_QUANT_RANGE;
      pxVar11->min = iVar9;
      pxVar11->max = iVar10;
      return 1;
    }
    if (bVar2 != 0x3f) {
      return 1;
    }
  }
  if (ctxt->atom != (xmlRegAtomPtr)0x0) {
    if (bVar2 == 0x3f) {
      xVar7 = XML_REGEXP_QUANT_OPT;
    }
    else if (bVar2 == 0x2b) {
      xVar7 = XML_REGEXP_QUANT_PLUS;
    }
    else {
      if (bVar2 != 0x2a) goto LAB_00178bc1;
      xVar7 = XML_REGEXP_QUANT_MULT;
    }
    ctxt->atom->quant = xVar7;
  }
LAB_00178bc1:
  ctxt->cur = pbVar5 + 1;
  return 1;
}

Assistant:

static int
xmlFAParsePiece(xmlRegParserCtxtPtr ctxt) {
    int ret;

    ctxt->atom = NULL;
    ret = xmlFAParseAtom(ctxt);
    if (ret == 0)
	return(0);
    if (ctxt->atom == NULL) {
	ERROR("internal: no atom generated");
    }
    xmlFAParseQuantifier(ctxt);
    return(1);
}